

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

void __thiscall Sym::Sym(Sym *this,string *type,string *name,string *value)

{
  pointer pcVar1;
  int iVar2;
  Sym *pSVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  double dVar6;
  string local_70;
  string local_50;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Type)._M_dataplus._M_p = (pointer)&(this->Type).field_2;
  (this->Type)._M_string_length = 0;
  (this->Type).field_2._M_local_buf[0] = '\0';
  this->iValue = 0;
  this->dValue = 0.0;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->Type);
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    paVar5 = &local_50.field_2;
    pcVar1 = (value->_M_dataplus)._M_p;
    pSVar3 = (Sym *)&local_50;
    local_50._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pSVar3,pcVar1,pcVar1 + value->_M_string_length);
    dVar6 = str2double(pSVar3,&local_50);
    this->dValue = dVar6;
    _Var4._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar5 = &local_70.field_2;
    pcVar1 = (value->_M_dataplus)._M_p;
    pSVar3 = (Sym *)&local_70;
    local_70._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pSVar3,pcVar1,pcVar1 + value->_M_string_length);
    iVar2 = str2int(pSVar3,&local_70);
    this->iValue = iVar2;
    _Var4._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return;
}

Assistant:

Sym::Sym(std::string type, std::string name, std::string value) {
    Name = name;
    Type = type;
    if (type == "real") {
        dValue = str2double(value);
    } else {//int
        iValue = str2int(value);
    }
}